

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O3

value value_type_create(void *data,size_t bytes,type_id id)

{
  value v;
  type_id local_1c;
  
  local_1c = id;
  v = value_alloc(bytes + 4);
  if (v != (value)0x0) {
    value_from(v,data,bytes);
    value_from((value)((long)v + bytes),&local_1c,4);
  }
  return v;
}

Assistant:

value value_type_create(const void *data, size_t bytes, type_id id)
{
	value v = value_alloc(bytes + sizeof(type_id));

	if (v == NULL)
	{
		return NULL;
	}

	/* Memset body */
	value_from(v, data, bytes);

	/* Memset header */
	value_from((value)(((uintptr_t)v) + bytes), &id, sizeof(type_id));

	return v;
}